

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

TonkResult tonk_set_default_socket_config(uint32_t tonk_version,TonkSocketConfig *configOut)

{
  if (tonk_version == 9 && configOut != (TonkSocketConfig *)0x0) {
    configOut->Version = 9;
    *(undefined8 *)&configOut->field_0x4 = 0;
    *(undefined8 *)((long)&configOut->AppContextPtr + 4) = 0;
    configOut->UDPSendBufferSizeBytes = 2000000;
    configOut->UDPRecvBufferSizeBytes = 2000000;
    configOut->UDPListenPort = 0;
    configOut->MaximumClients = 0;
    configOut->MaximumClientsPerIP = 10;
    configOut->MinuteFloodThresh = 0x78;
    configOut->TimerIntervalUsec = 30000;
    configOut->NoDataTimeoutUsec = 20000000;
    configOut->UDPConnectIntervalUsec = 100000;
    configOut->ConnectionTimeoutUsec = 4000000;
    *(undefined4 *)&configOut->field_0x3c = 0;
    configOut->InterfaceAddress = (char *)0x0;
    configOut->BandwidthLimitBPS = 20000000;
    *(undefined8 *)&configOut->Flags = 0;
    *(undefined8 *)((long)&configOut->OnIncomingConnection + 4) = 0;
    *(undefined8 *)((long)&configOut->OnP2PConnectionStart + 4) = 0;
    *(undefined8 *)((long)&configOut->OnAdvertisement + 4) = 0;
    configOut->OnP2PConnectionStart =
         (_func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *
         )0x0;
    configOut->OnAdvertisement =
         (_func_void_TonkAppContextPtr_TonkSocket_char_ptr_uint16_t_uint8_t_ptr_uint32_t *)0x0;
    configOut->SendToAppContextPtr = (TonkAppContextPtr)0x0;
    configOut->SendToHook = (_func_void_TonkAppContextPtr_uint16_t_uint8_t_ptr_uint32_t *)0x0;
  }
  return (uint)(tonk_version != 9 || configOut == (TonkSocketConfig *)0x0);
}

Assistant:

TONK_EXPORT TonkResult tonk_set_default_socket_config(
    uint32_t tonk_version,
    TonkSocketConfig* configOut)
{
    // NOTE: We cannot use the logger in this code path because it may have
    // been shutdown.

    if (!configOut || tonk_version != TONK_VERSION)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    *configOut = TonkSocketConfig();
    return Tonk_Success;
}